

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O2

void __thiscall
CServerBrowserFilter::Sort
          (CServerBrowserFilter *this,CServerEntry **ppServerlist,int NumServers,int ResortFlags)

{
  CServerFilter *this_00;
  uint uVar1;
  CServerFilter *pCVar2;
  uint uVar3;
  long lVar4;
  int i;
  long lVar5;
  
  this->m_ppServerlist = ppServerlist;
  this->m_NumServers = NumServers;
  lVar4 = 0;
  lVar5 = 0;
  do {
    if ((this->m_lFilters).num_elements <= lVar5) {
      return;
    }
    pCVar2 = (this->m_lFilters).list;
    this_00 = (CServerFilter *)((long)((pCVar2->m_FilterInfo).m_aGametype + -2) + 8 + lVar4);
    if (((ResortFlags & 1U) == 0) &&
       ((uVar1 = *(uint *)((long)&((CServerFilterInfo *)((pCVar2->m_FilterInfo).m_aGametype + -1))->
                                  m_SortHash + lVar4), (ResortFlags & 2U) == 0 ||
        ((uVar1 & 0x400) == 0)))) {
      uVar3 = CServerFilter::GetSortHash(this_00);
      if (uVar1 != uVar3) goto LAB_00124de4;
    }
    else {
LAB_00124de4:
      CServerFilter::Sort(this_00);
    }
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0xe8;
  } while( true );
}

Assistant:

void CServerBrowserFilter::Sort(CServerEntry **ppServerlist, int NumServers, int ResortFlags)
{
	m_ppServerlist = ppServerlist;
	m_NumServers = NumServers;
	for(int i = 0; i < m_lFilters.size(); i++)
	{
		// check if we need to resort
		CServerFilter *pFilter = &m_lFilters[i];
		if((ResortFlags&RESORT_FLAG_FORCE) || ((ResortFlags&RESORT_FLAG_FAV) && pFilter->m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FAVORITE) || pFilter->m_FilterInfo.m_SortHash != pFilter->GetSortHash())
			pFilter->Sort();
	}
}